

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvt.cpp
# Opt level: O3

int __thiscall
btDbvt::clone(btDbvt *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  btDbvtNode *pbVar3;
  btDbvtNode *pbVar4;
  btScalar bVar5;
  btScalar bVar6;
  btScalar bVar7;
  btScalar bVar8;
  btScalar bVar9;
  btScalar bVar10;
  btScalar bVar11;
  undefined8 uVar12;
  int extraout_EAX;
  int extraout_EAX_00;
  sStkCLN *psVar13;
  btDbvtNode *pbVar14;
  btDbvtNode **ppbVar15;
  long lVar16;
  uint uVar17;
  btDbvtNode *pbVar18;
  uint uVar19;
  uint uVar20;
  btAlignedObjectArray<btDbvt::sStkCLN> stack;
  btAlignedObjectArray<btDbvt::sStkCLN> bStack_58;
  long *local_38;
  
  local_38 = (long *)__child_stack;
  clear((btDbvt *)__fn);
  pbVar18 = this->m_root;
  if (pbVar18 == (btDbvtNode *)0x0) {
    return extraout_EAX;
  }
  bStack_58.m_ownsMemory = true;
  bStack_58.m_data = (sStkCLN *)0x0;
  bStack_58.m_size = 0;
  bStack_58.m_capacity = 0;
  uVar19 = this->m_leaves;
  if ((long)(int)uVar19 < 1) {
    uVar17 = 1;
  }
  else {
    psVar13 = (sStkCLN *)btAlignedAllocInternal((long)(int)uVar19 << 4,0x10);
    if ((long)bStack_58.m_size < 1) {
      if (bStack_58.m_data != (sStkCLN *)0x0) goto LAB_0013468b;
    }
    else {
      lVar16 = 0;
      do {
        puVar1 = (undefined8 *)((long)&(bStack_58.m_data)->node + lVar16);
        uVar12 = puVar1[1];
        puVar2 = (undefined8 *)((long)&psVar13->node + lVar16);
        *puVar2 = *puVar1;
        puVar2[1] = uVar12;
        lVar16 = lVar16 + 0x10;
      } while ((long)bStack_58.m_size << 4 != lVar16);
LAB_0013468b:
      if (bStack_58.m_ownsMemory == true) {
        btAlignedFreeInternal(bStack_58.m_data);
      }
    }
    pbVar18 = this->m_root;
    uVar20 = bStack_58.m_size;
    if ((bStack_58.m_size != uVar19) ||
       (uVar17 = uVar19 * 2, uVar20 = uVar19, bStack_58.m_data = psVar13,
       bStack_58.m_capacity = uVar19, SBORROW4(uVar19,uVar17) == 0 < (int)uVar19))
    goto LAB_00134728;
  }
  bStack_58.m_ownsMemory = true;
  psVar13 = (sStkCLN *)btAlignedAllocInternal((ulong)uVar17 << 4,0x10);
  uVar20 = bStack_58.m_size;
  uVar19 = uVar17;
  if ((long)bStack_58.m_size < 1) {
    if (bStack_58.m_data == (sStkCLN *)0x0) goto LAB_00134728;
  }
  else {
    lVar16 = 0;
    do {
      puVar1 = (undefined8 *)((long)&(bStack_58.m_data)->node + lVar16);
      uVar12 = puVar1[1];
      puVar2 = (undefined8 *)((long)&psVar13->node + lVar16);
      *puVar2 = *puVar1;
      puVar2[1] = uVar12;
      lVar16 = lVar16 + 0x10;
    } while ((long)bStack_58.m_size << 4 != lVar16);
  }
  if (bStack_58.m_ownsMemory == true) {
    btAlignedFreeInternal(bStack_58.m_data);
    uVar20 = bStack_58.m_size;
  }
LAB_00134728:
  bStack_58.m_capacity = uVar19;
  bStack_58.m_data = psVar13;
  bStack_58.m_ownsMemory = true;
  bStack_58.m_data[(int)uVar20].node = pbVar18;
  bStack_58.m_data[(int)uVar20].parent = (btDbvtNode *)0x0;
  bStack_58.m_size = uVar20 + 1;
  do {
    uVar19 = bStack_58.m_size - 1;
    pbVar18 = bStack_58.m_data[(long)bStack_58.m_size + -1].node;
    pbVar3 = bStack_58.m_data[(long)bStack_58.m_size + -1].parent;
    pbVar4 = (pbVar18->field_2).childs[0];
    pbVar14 = *(btDbvtNode **)(__fn + 8);
    if (pbVar14 == (btDbvtNode *)0x0) {
      pbVar14 = (btDbvtNode *)btAlignedAllocInternal(0x38,0x10);
      pbVar14->parent = (btDbvtNode *)0x0;
      (pbVar14->field_2).childs[0] = (btDbvtNode *)0x0;
      (pbVar14->volume).mx.m_floats[0] = 0.0;
      (pbVar14->volume).mx.m_floats[1] = 0.0;
      (pbVar14->volume).mx.m_floats[2] = 0.0;
      (pbVar14->volume).mx.m_floats[3] = 0.0;
      (pbVar14->volume).mi.m_floats[0] = 0.0;
      (pbVar14->volume).mi.m_floats[1] = 0.0;
      (pbVar14->volume).mi.m_floats[2] = 0.0;
      (pbVar14->volume).mi.m_floats[3] = 0.0;
      (pbVar14->field_2).childs[1] = (btDbvtNode *)0x0;
      bStack_58.m_size = bStack_58.m_size - 1;
    }
    else {
      *(undefined8 *)(__fn + 8) = 0;
      bStack_58.m_size = uVar19;
    }
    pbVar14->parent = pbVar3;
    (pbVar14->field_2).childs[0] = pbVar4;
    (pbVar14->field_2).childs[1] = (btDbvtNode *)0x0;
    bVar5 = (pbVar18->volume).mi.m_floats[1];
    bVar6 = (pbVar18->volume).mi.m_floats[2];
    bVar7 = (pbVar18->volume).mi.m_floats[3];
    bVar8 = (pbVar18->volume).mx.m_floats[0];
    bVar9 = (pbVar18->volume).mx.m_floats[1];
    bVar10 = (pbVar18->volume).mx.m_floats[2];
    bVar11 = (pbVar18->volume).mx.m_floats[3];
    (pbVar14->volume).mi.m_floats[0] = (pbVar18->volume).mi.m_floats[0];
    (pbVar14->volume).mi.m_floats[1] = bVar5;
    (pbVar14->volume).mi.m_floats[2] = bVar6;
    (pbVar14->volume).mi.m_floats[3] = bVar7;
    (pbVar14->volume).mx.m_floats[0] = bVar8;
    (pbVar14->volume).mx.m_floats[1] = bVar9;
    (pbVar14->volume).mx.m_floats[2] = bVar10;
    (pbVar14->volume).mx.m_floats[3] = bVar11;
    ppbVar15 = (btDbvtNode **)((long)(&pbVar3->volume + 1) + ((ulong)(uVar19 & 1) + 1) * 8);
    if (pbVar3 == (btDbvtNode *)0x0) {
      ppbVar15 = (btDbvtNode **)__fn;
    }
    *ppbVar15 = pbVar14;
    if ((pbVar18->field_2).childs[1] == (btDbvtNode *)0x0) {
      (**(code **)(*local_38 + 0x10))(local_38,pbVar14);
    }
    else {
      pbVar3 = (pbVar18->field_2).childs[0];
      uVar19 = bStack_58.m_capacity;
      if (bStack_58.m_size == bStack_58.m_capacity) {
        uVar17 = bStack_58.m_size * 2;
        if (bStack_58.m_size == 0) {
          uVar17 = 1;
        }
        uVar19 = bStack_58.m_size;
        if (bStack_58.m_size < (int)uVar17) {
          if (uVar17 == 0) {
            psVar13 = (sStkCLN *)0x0;
          }
          else {
            psVar13 = (sStkCLN *)btAlignedAllocInternal((long)(int)uVar17 << 4,0x10);
          }
          if (bStack_58.m_size < 1) {
            if (bStack_58.m_data != (sStkCLN *)0x0) goto LAB_0013487a;
          }
          else {
            lVar16 = 0;
            do {
              puVar1 = (undefined8 *)((long)&(bStack_58.m_data)->node + lVar16);
              uVar12 = puVar1[1];
              puVar2 = (undefined8 *)((long)&psVar13->node + lVar16);
              *puVar2 = *puVar1;
              puVar2[1] = uVar12;
              lVar16 = lVar16 + 0x10;
            } while ((ulong)(uint)bStack_58.m_size << 4 != lVar16);
LAB_0013487a:
            if (bStack_58.m_ownsMemory == true) {
              btAlignedFreeInternal(bStack_58.m_data);
            }
          }
          bStack_58.m_ownsMemory = true;
          uVar19 = uVar17;
          bStack_58.m_data = psVar13;
          bStack_58.m_capacity = uVar17;
        }
      }
      bStack_58.m_data[bStack_58.m_size].node = pbVar3;
      bStack_58.m_data[bStack_58.m_size].parent = pbVar14;
      bStack_58.m_size = bStack_58.m_size + 1;
      pbVar18 = (pbVar18->field_2).childs[1];
      uVar17 = bStack_58.m_size;
      if (bStack_58.m_size == uVar19) {
        uVar20 = uVar19 * 2;
        if (uVar19 == 0) {
          uVar20 = 1;
        }
        uVar17 = uVar19;
        if ((int)uVar19 < (int)uVar20) {
          if (uVar20 == 0) {
            psVar13 = (sStkCLN *)0x0;
          }
          else {
            psVar13 = (sStkCLN *)btAlignedAllocInternal((long)(int)uVar20 << 4,0x10);
            uVar19 = bStack_58.m_size;
          }
          if ((int)uVar19 < 1) {
            if (bStack_58.m_data != (sStkCLN *)0x0) goto LAB_00134929;
          }
          else {
            lVar16 = 0;
            do {
              puVar1 = (undefined8 *)((long)&(bStack_58.m_data)->node + lVar16);
              uVar12 = puVar1[1];
              puVar2 = (undefined8 *)((long)&psVar13->node + lVar16);
              *puVar2 = *puVar1;
              puVar2[1] = uVar12;
              lVar16 = lVar16 + 0x10;
            } while ((ulong)uVar19 << 4 != lVar16);
LAB_00134929:
            if (bStack_58.m_ownsMemory == true) {
              btAlignedFreeInternal(bStack_58.m_data);
              uVar19 = bStack_58.m_size;
            }
          }
          bStack_58.m_ownsMemory = true;
          uVar17 = uVar19;
          bStack_58.m_data = psVar13;
          bStack_58.m_capacity = uVar20;
        }
      }
      bStack_58.m_data[(int)uVar17].node = pbVar18;
      bStack_58.m_data[(int)uVar17].parent = pbVar14;
      bStack_58.m_size = uVar17 + 1;
    }
    if (bStack_58.m_size < 1) {
      btAlignedObjectArray<btDbvt::sStkCLN>::~btAlignedObjectArray(&bStack_58);
      return extraout_EAX_00;
    }
  } while( true );
}

Assistant:

void			btDbvt::clone(btDbvt& dest,IClone* iclone) const
{
	dest.clear();
	if(m_root!=0)
	{	
		btAlignedObjectArray<sStkCLN>	stack;
		stack.reserve(m_leaves);
		stack.push_back(sStkCLN(m_root,0));
		do	{
			const int		i=stack.size()-1;
			const sStkCLN	e=stack[i];
			btDbvtNode*			n=createnode(&dest,e.parent,e.node->volume,e.node->data);
			stack.pop_back();
			if(e.parent!=0)
				e.parent->childs[i&1]=n;
			else
				dest.m_root=n;
			if(e.node->isinternal())
			{
				stack.push_back(sStkCLN(e.node->childs[0],n));
				stack.push_back(sStkCLN(e.node->childs[1],n));
			}
			else
			{
				iclone->CloneLeaf(n);
			}
		} while(stack.size()>0);
	}
}